

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenBracket(Lexer *this)

{
  char cVar1;
  Lexer *in_RSI;
  undefined1 local_52 [2];
  string local_50;
  
  cVar1 = (char)in_RSI->currentChar;
  nextChar(in_RSI);
  if (cVar1 == '}') {
    local_52 = (undefined1  [2])0x14;
    getCurrentCursor((Position *)(local_52 + 2),in_RSI);
    std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
              ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_52);
  }
  else if (cVar1 == ']') {
    local_52 = (undefined1  [2])0x13;
    getCurrentCursor((Position *)(local_52 + 2),in_RSI);
    std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
              ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_52);
  }
  else if (cVar1 == ')') {
    local_52 = (undefined1  [2])0x12;
    getCurrentCursor((Position *)(local_52 + 2),in_RSI);
    std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
              ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_52);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_52 + 2),"Unexpected branch reached",(allocator<char> *)local_52);
    fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_lexer/src/lexer_next.cpp"
          ,0x232,(string *)(local_52 + 2));
    std::__cxx11::string::~string((string *)(local_52 + 2));
    this->_vptr_Lexer = (_func_int **)0x0;
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenBracket() noexcept {
  const char c = currentChar;
  nextChar(); // eat bracket
  switch (c) {
  case ')':
    return std::make_unique<Token>(currentToken, TokenType::TOK_BRACKET_CLOSE, getCurrentCursor());
  case ']':
    return std::make_unique<Token>(currentToken, TokenType::TOK_ARR_BRACKET_CLOSE, getCurrentCursor());
  case '}':
    return std::make_unique<Token>(currentToken, TokenType::TOK_TEMPL_BRACKET_CLOSE, getCurrentCursor());
  default:
    fatal(__FILE__, __LINE__, "Unexpected branch reached");
    return nullptr;
  }
}